

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigPrintSimClasses(Ivy_FraigMan_t *p)

{
  uint uVar1;
  Ivy_Obj_t *local_18;
  Ivy_Obj_t *pClass;
  Ivy_FraigMan_t *p_local;
  
  for (local_18 = (p->lClasses).pHead; local_18 != (Ivy_Obj_t *)0x0;
      local_18 = Ivy_ObjEquivListNext(local_18)) {
    uVar1 = Ivy_FraigCountClassNodes(local_18);
    printf("%d ",(ulong)uVar1);
  }
  return;
}

Assistant:

void Ivy_FraigPrintSimClasses( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pClass;
    Ivy_FraigForEachEquivClass( p->lClasses.pHead, pClass )
    {
//        Ivy_FraigPrintClass( pClass );
        printf( "%d ", Ivy_FraigCountClassNodes( pClass ) );
    }
//    printf( "\n" );
}